

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)

{
  xmlDocPtr cur;
  void **ppvVar1;
  xmlDocPtr copy;
  xmlRelaxNGParserCtxtPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    cur = xmlCopyDoc(doc,1);
    if (cur == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)(*xmlMalloc)(0x110);
      if (doc_local == (xmlDocPtr)0x0) {
        xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0);
        xmlFreeDoc(cur);
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        memset(doc_local,0,0x110);
        doc_local->URL = (xmlChar *)cur;
        doc_local[1].standalone = 1;
        ppvVar1 = __xmlGenericErrorContext();
        doc_local->_private = *ppvVar1;
      }
    }
  }
  return (xmlRelaxNGParserCtxtPtr)doc_local;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)
{
    xmlRelaxNGParserCtxtPtr ret;
    xmlDocPtr copy;

    if (doc == NULL)
        return (NULL);
    copy = xmlCopyDoc(doc, 1);
    if (copy == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL);
        xmlFreeDoc(copy);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->document = copy;
    ret->freedoc = 1;
    ret->userData = xmlGenericErrorContext;
    return (ret);
}